

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O1

void __thiscall SCCLiveness::ProcessRegDef(SCCLiveness *this,RegOpnd *regDef,Instr *instr)

{
  RegNum RVar1;
  IRType type;
  uint uVar2;
  BVIndex index;
  StackSym *stackSym;
  Opnd *this_00;
  _func_int *p_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  ushort uVar7;
  uint32 uVar8;
  uint newUseValue;
  undefined4 *puVar9;
  Lifetime *lifetime;
  
  stackSym = regDef->m_sym;
  if ((stackSym == (StackSym *)0x0) || (regDef->m_reg != RegNOREG)) {
    this_00 = instr->m_src1;
    bVar5 = LowererMD::IsAssign(instr);
    if ((bVar5) && (OVar6 = IR::Opnd::GetKind(this_00), OVar6 == OpndKindReg)) {
      OVar6 = IR::Opnd::GetKind(this_00);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_0062a6a9;
        *puVar9 = 0;
      }
      if (this_00[1]._vptr_Opnd != (_func_int **)0x0) {
        OVar6 = IR::Opnd::GetKind(this_00);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar5) goto LAB_0062a6a9;
          *puVar9 = 0;
        }
        p_Var3 = this_00[1]._vptr_Opnd[9];
        RVar1 = regDef->m_reg;
        BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
        *(ulong *)(p_Var3 + 0x70) = *(ulong *)(p_Var3 + 0x70) | 1L << (RVar1 & (RegXMM15|RegXMM14));
      }
    }
    if (stackSym == (StackSym *)0x0) {
      return;
    }
  }
  if (((stackSym->field_0x1a & 0x10) != 0) && (*(short *)&(stackSym->super_Sym).field_0x16 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar5) goto LAB_0062a6a9;
    *puVar9 = 0;
  }
  if ((stackSym->field_0x1a & 0x10) == 0) {
    lifetime = *(Lifetime **)&(stackSym->scratch).globOpt;
    if (lifetime == (Lifetime *)0x0) {
      lifetime = InsertLifetime(this,stackSym,regDef->m_reg,instr);
      lifetime->region = this->curRegion;
      type = (regDef->super_Opnd).m_type;
      uVar7 = 0x2000;
      if (1 < (byte)(type - TyFloat32)) {
        bVar5 = IRType_IsSimd128(type);
        uVar7 = (ushort)bVar5 << 0xd;
      }
      *(ushort *)&lifetime->field_0x9c =
           uVar7 | (ushort)*(undefined4 *)&lifetime->field_0x9c & 0xdfff;
    }
    else {
      uVar2 = lifetime->start;
      uVar8 = IR::Instr::GetNumber(instr);
      if (uVar8 < uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                           ,0x294,"(lifetime->start <= instr->GetNumber())",
                           "Lifetime start not set correctly");
        if (!bVar5) {
LAB_0062a6a9:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      ExtendLifetime(this,lifetime,instr);
      if ((lifetime->region != this->curRegion) && (bVar5 = Func::DoOptimizeTry(this->func), !bVar5)
         ) {
        lifetime->field_0x9d = lifetime->field_0x9d | 1;
      }
    }
    newUseValue = LinearScan::GetUseSpillCost
                            ((uint)this->loopNest,
                             (uint)(this->lastOpHelperLabel != (LabelInstr *)0x0));
    Lifetime::AddToUseCount(lifetime,newUseValue,this->curLoop,this->func);
    index = TySize[(regDef->super_Opnd).m_type];
    BVUnitT<unsigned_long>::AssertRange(index);
    (lifetime->intUsageBv).word = (lifetime->intUsageBv).word | 1L << ((byte)index & 0x3f);
  }
  return;
}

Assistant:

void
SCCLiveness::ProcessRegDef(IR::RegOpnd *regDef, IR::Instr *instr)
{
    StackSym * stackSym = regDef->m_sym;

    // PhysReg
    if (stackSym == nullptr || regDef->GetReg() != RegNOREG)
    {
        IR::Opnd *src = instr->GetSrc1();

        // If this symbol is assigned to a physical register, let's tell the register
        // allocator to prefer assigning that register to the lifetime.
        //
        // Note: this only pays off if this is the last-use of the symbol, but
        // unfortunately we don't have a way to tell that currently...
        if (LowererMD::IsAssign(instr) && src->IsRegOpnd() && src->AsRegOpnd()->m_sym)
        {
            StackSym *srcSym = src->AsRegOpnd()->m_sym;

            srcSym->scratch.linearScan.lifetime->regPreference.Set(regDef->GetReg());
        }

        // This physreg doesn't have a lifetime, just return.
        if (stackSym == nullptr)
        {
            return;
        }
    }

    // Arg slot sym can be in a RegOpnd for param passed via registers
    // Skip creating a lifetime for those.
    if (stackSym->IsArgSlotSym())
    {
        return;
    }

    // We'll extend the lifetime only if there are uses in a different loop region
    // from one of the defs.

    Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;

    if (lifetime == nullptr)
    {
        lifetime = this->InsertLifetime(stackSym, regDef->GetReg(), instr);
        lifetime->region = this->curRegion;
        lifetime->isFloat = regDef->IsFloat() || regDef->IsSimd128();
    }
    else
    {
        AssertMsg(lifetime->start <= instr->GetNumber(), "Lifetime start not set correctly");

        ExtendLifetime(lifetime, instr);

        if (lifetime->region != this->curRegion && !this->func->DoOptimizeTry())
        {
            lifetime->dontAllocate = true;
        }
    }
    lifetime->AddToUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->lastOpHelperLabel != nullptr)), this->curLoop, this->func);
    lifetime->intUsageBv.Set(TySize[regDef->GetType()]);
}